

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O1

Frag __thiscall
re2::Compiler::PostVisit
          (Compiler *this,Regexp *re,Frag param_2,Frag param_3,Frag *child_frags,int nchild_frags)

{
  CharClass CVar1;
  Rune lo;
  int n;
  CharClass *pCVar2;
  CharClass foldcase;
  uint uVar3;
  Frag FVar4;
  Frag FVar5;
  Frag a;
  EmptyOp empty;
  long lVar6;
  int *piVar7;
  ulong uVar8;
  LogMessage local_1b0;
  
  uVar8 = 0;
  if (this->failed_ != false) goto switchD_001242b9_caseD_1;
  switch(re->op_) {
  case '\x01':
    goto switchD_001242b9_caseD_1;
  case '\x02':
    goto switchD_001242b9_caseD_2;
  case '\x03':
    FVar4 = Literal(this,(re->field_7).rune_,(bool)((byte)re->parse_flags_ & 1));
    FVar5 = FVar4;
    break;
  case '\x04':
    if ((re->field_7).field_0.max_ != 0) {
      if (re->op_ == '\x04') {
        lVar6 = 0;
        FVar4.begin = 0;
        FVar4.end.p = 0;
        uVar8 = 0;
        do {
          if ((re->field_7).field_0.max_ <= lVar6) goto LAB_00124686;
          FVar5 = Literal(this,*(Rune *)((long)&(((re->field_7).field_1.name_)->_M_dataplus)._M_p +
                                        lVar6 * 4),(bool)((byte)re->parse_flags_ & 1));
          if (lVar6 != 0) {
            FVar5 = Cat(this,(Frag)((ulong)FVar4 | uVar8 << 0x20),FVar5);
          }
          uVar8 = (ulong)FVar5 >> 0x20;
          lVar6 = lVar6 + 1;
          FVar4 = (Frag)((ulong)FVar5 & 0xffffffff);
        } while (re->op_ == '\x04');
      }
      __assert_fail("(op_) == (kRegexpLiteralString)",
                    "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/regexp.h",
                    0x14e,"int re2::Regexp::nrunes()");
    }
    goto switchD_001242b9_caseD_2;
  case '\x05':
    FVar4 = *child_frags;
    FVar5 = FVar4;
    if (1 < nchild_frags) {
      uVar8 = 1;
      do {
        FVar4 = Cat(this,FVar4,child_frags[uVar8]);
        uVar8 = uVar8 + 1;
        FVar5 = FVar4;
      } while ((uint)nchild_frags != uVar8);
    }
    break;
  case '\x06':
    FVar4 = *child_frags;
    FVar5 = FVar4;
    if (1 < nchild_frags) {
      uVar8 = 1;
      do {
        FVar4 = Alt(this,FVar4,child_frags[uVar8]);
        uVar8 = uVar8 + 1;
        FVar5 = FVar4;
      } while ((uint)nchild_frags != uVar8);
    }
    break;
  case '\a':
    FVar4 = Star(this,*child_frags,SUB41((re->parse_flags_ & 0x40) >> 6,0));
    FVar5 = FVar4;
    break;
  case '\b':
    FVar4 = *child_frags;
    FVar5 = Star(this,FVar4,SUB41((re->parse_flags_ & 0x40) >> 6,0));
    break;
  case '\t':
    FVar4 = Quest(this,*child_frags,SUB41((re->parse_flags_ & 0x40) >> 6,0));
    FVar5 = FVar4;
    break;
  default:
    LogMessage::LogMessage
              (&local_1b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/compile.cc",
               0x3dd,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1b0.str_,"Missing case in Compiler: ",0x1a);
    std::ostream::operator<<((ostream *)&local_1b0.str_,(uint)re->op_);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b0);
    this->failed_ = true;
    goto switchD_001242b9_caseD_1;
  case '\v':
    n = (re->field_7).field_0.max_;
    FVar4 = *child_frags;
    FVar5 = FVar4;
    if (-1 < n) {
      FVar4 = Capture(this,FVar4,n);
      FVar5 = FVar4;
    }
    break;
  case '\f':
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_int>,_std::_Select1st<std::pair<const_unsigned_long,_int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_int>_>_>
    ::clear(&(this->rune_cache_)._M_t);
    (this->rune_range_).begin = 0;
    (this->rune_range_).end = 0;
    AddRuneRange(this,0,0x10ffff,false);
LAB_001243aa:
    FVar4 = this->rune_range_;
    FVar5 = FVar4;
    break;
  case '\r':
    FVar4 = ByteRange(this,0,0xff,false);
    FVar5 = FVar4;
    break;
  case '\x0e':
    empty = this->reversed_ + kEmptyBeginLine;
    goto LAB_00124630;
  case '\x0f':
    empty = kEmptyEndLine - this->reversed_;
    goto LAB_00124630;
  case '\x10':
    empty = kEmptyWordBoundary;
    goto LAB_00124630;
  case '\x11':
    empty = kEmptyNonWordBoundary;
    goto LAB_00124630;
  case '\x12':
    uVar3 = (uint)this->reversed_;
    goto LAB_00124626;
  case '\x13':
    uVar3 = this->reversed_ ^ 1;
LAB_00124626:
    empty = uVar3 * 4 + kEmptyBeginText;
LAB_00124630:
    FVar4 = EmptyWidth(this,empty);
    FVar5 = FVar4;
    break;
  case '\x14':
    pCVar2 = (re->field_7).field_3.cc_;
    if (*(int *)(pCVar2 + 4) != 0) {
      CVar1 = *pCVar2;
      std::
      _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_int>,_std::_Select1st<std::pair<const_unsigned_long,_int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_int>_>_>
      ::clear(&(this->rune_cache_)._M_t);
      (this->rune_range_).begin = 0;
      (this->rune_range_).end = 0;
      if (*(int *)(pCVar2 + 0x10) != 0) {
        piVar7 = *(int **)(pCVar2 + 8);
        do {
          if (((CVar1 == (CharClass)0x0) || (*piVar7 < 0x41)) || (0x5a < piVar7[1])) {
            lo = *piVar7;
            if (((lo < 0x42) && (0x79 < piVar7[1])) ||
               ((0x7a < lo || piVar7[1] < 0x41 || (foldcase = CVar1, piVar7[1] < 0x61 && 0x5a < lo))
               )) {
              foldcase = (CharClass)0x0;
            }
            AddRuneRange(this,lo,piVar7[1],(bool)foldcase);
          }
          piVar7 = piVar7 + 2;
        } while (piVar7 != (int *)((long)*(int *)(pCVar2 + 0x10) * 8 + *(long *)(pCVar2 + 8)));
      }
      goto LAB_001243aa;
    }
    LogMessage::LogMessage
              (&local_1b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/compile.cc",
               0x3a3,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1b0.str_,"No ranges in char class",0x17);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b0);
    this->failed_ = true;
    FVar4.begin = 0;
    FVar4.end.p = 0;
    FVar5 = FVar4;
    break;
  case '\x15':
    FVar4 = Match(this,(re->field_7).field_0.max_);
    FVar5 = FVar4;
    if (this->anchor_ != ANCHOR_BOTH) {
      FVar5 = DotStar(this);
      a = EmptyWidth(this,kEmptyEndText);
      FVar4 = Cat(this,a,FVar4);
      FVar4 = Cat(this,FVar5,FVar4);
      FVar5 = FVar4;
    }
  }
LAB_00124682:
  uVar8 = (ulong)FVar5 >> 0x20;
LAB_00124686:
  return (Frag)((ulong)FVar4 & 0xffffffff | uVar8 << 0x20);
switchD_001242b9_caseD_2:
  FVar4 = Nop(this);
  FVar5 = FVar4;
  goto LAB_00124682;
switchD_001242b9_caseD_1:
  FVar4.begin = 0;
  FVar4.end.p = 0;
  goto LAB_00124686;
}

Assistant:

Frag Compiler::PostVisit(Regexp* re, Frag, Frag, Frag* child_frags,
                         int nchild_frags) {
  // If a child failed, don't bother going forward, especially
  // since the child_frags might contain Frags with NULLs in them.
  if (failed_)
    return NoMatch();

  // Given the child fragments, return the fragment for this node.
  switch (re->op()) {
    case kRegexpRepeat:
      // Should not see; code at bottom of function will print error
      break;

    case kRegexpNoMatch:
      return NoMatch();

    case kRegexpEmptyMatch:
      return Nop();

    case kRegexpHaveMatch: {
      Frag f = Match(re->match_id());
      // Remember unanchored match to end of string.
      if (anchor_ != RE2::ANCHOR_BOTH)
        f = Cat(DotStar(), Cat(EmptyWidth(kEmptyEndText), f));
      return f;
    }

    case kRegexpConcat: {
      Frag f = child_frags[0];
      for (int i = 1; i < nchild_frags; i++)
        f = Cat(f, child_frags[i]);
      return f;
    }

    case kRegexpAlternate: {
      Frag f = child_frags[0];
      for (int i = 1; i < nchild_frags; i++)
        f = Alt(f, child_frags[i]);
      return f;
    }

    case kRegexpStar:
      return Star(child_frags[0], (re->parse_flags()&Regexp::NonGreedy) != 0);

    case kRegexpPlus:
      return Plus(child_frags[0], (re->parse_flags()&Regexp::NonGreedy) != 0);

    case kRegexpQuest:
      return Quest(child_frags[0], (re->parse_flags()&Regexp::NonGreedy) != 0);

    case kRegexpLiteral:
      return Literal(re->rune(), (re->parse_flags()&Regexp::FoldCase) != 0);

    case kRegexpLiteralString: {
      // Concatenation of literals.
      if (re->nrunes() == 0)
        return Nop();
      Frag f;
      for (int i = 0; i < re->nrunes(); i++) {
        Frag f1 = Literal(re->runes()[i],
                          (re->parse_flags()&Regexp::FoldCase) != 0);
        if (i == 0)
          f = f1;
        else
          f = Cat(f, f1);
      }
      return f;
    }

    case kRegexpAnyChar:
      BeginRange();
      AddRuneRange(0, Runemax, false);
      return EndRange();

    case kRegexpAnyByte:
      return ByteRange(0x00, 0xFF, false);

    case kRegexpCharClass: {
      CharClass* cc = re->cc();
      if (cc->empty()) {
        // This can't happen.
        LOG(DFATAL) << "No ranges in char class";
        failed_ = true;
        return NoMatch();
      }

      // ASCII case-folding optimization: if the char class
      // behaves the same on A-Z as it does on a-z,
      // discard any ranges wholly contained in A-Z
      // and mark the other ranges as foldascii.
      // This reduces the size of a program for
      // (?i)abc from 3 insts per letter to 1 per letter.
      bool foldascii = cc->FoldsASCII();

      // Character class is just a big OR of the different
      // character ranges in the class.
      BeginRange();
      for (CharClass::iterator i = cc->begin(); i != cc->end(); ++i) {
        // ASCII case-folding optimization (see above).
        if (foldascii && 'A' <= i->lo && i->hi <= 'Z')
          continue;

        // If this range contains all of A-Za-z or none of it,
        // the fold flag is unnecessary; don't bother.
        bool fold = foldascii;
        if ((i->lo <= 'A' && 'z' <= i->hi) || i->hi < 'A' || 'z' < i->lo ||
            ('Z' < i->lo && i->hi < 'a'))
          fold = false;

        AddRuneRange(i->lo, i->hi, fold);
      }
      return EndRange();
    }

    case kRegexpCapture:
      // If this is a non-capturing parenthesis -- (?:foo) --
      // just use the inner expression.
      if (re->cap() < 0)
        return child_frags[0];
      return Capture(child_frags[0], re->cap());

    case kRegexpBeginLine:
      return EmptyWidth(reversed_ ? kEmptyEndLine : kEmptyBeginLine);

    case kRegexpEndLine:
      return EmptyWidth(reversed_ ? kEmptyBeginLine : kEmptyEndLine);

    case kRegexpBeginText:
      return EmptyWidth(reversed_ ? kEmptyEndText : kEmptyBeginText);

    case kRegexpEndText:
      return EmptyWidth(reversed_ ? kEmptyBeginText : kEmptyEndText);

    case kRegexpWordBoundary:
      return EmptyWidth(kEmptyWordBoundary);

    case kRegexpNoWordBoundary:
      return EmptyWidth(kEmptyNonWordBoundary);
  }
  LOG(DFATAL) << "Missing case in Compiler: " << re->op();
  failed_ = true;
  return NoMatch();
}